

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_bool nk_do_button_symbol(nk_flags *state,nk_command_buffer *out,nk_rect bounds,
                           nk_symbol_type symbol,nk_button_behavior behavior,nk_style_button *style,
                           nk_input *in,nk_user_font *font)

{
  undefined4 in_EAX;
  int iVar1;
  nk_bool nVar2;
  undefined1 auVar3 [16];
  nk_rect content;
  nk_rect local_50;
  nk_rect local_40;
  
  auVar3._0_4_ = -(uint)(out == (nk_command_buffer *)0x0);
  auVar3._4_4_ = -(uint)(style == (nk_style_button *)0x0);
  auVar3._8_4_ = -(uint)(font == (nk_user_font *)0x0);
  auVar3._12_4_ = -(uint)(state == (nk_flags *)0x0);
  iVar1 = movmskps(in_EAX,auVar3);
  nVar2 = 0;
  if (iVar1 == 0) {
    local_50 = bounds;
    nVar2 = nk_do_button(state,out,bounds,style,in,behavior,&local_40);
    if (style->draw_begin != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
      (*style->draw_begin)(out,(nk_handle)(style->userdata).ptr);
    }
    nk_draw_button_symbol(out,&local_50,&local_40,*state,style,symbol,font);
    if (style->draw_end != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
      (*style->draw_end)(out,(nk_handle)(style->userdata).ptr);
    }
  }
  return nVar2;
}

Assistant:

NK_LIB nk_bool
nk_do_button_symbol(nk_flags *state,
struct nk_command_buffer *out, struct nk_rect bounds,
enum nk_symbol_type symbol, enum nk_button_behavior behavior,
const struct nk_style_button *style, const struct nk_input *in,
const struct nk_user_font *font)
{
int ret;
struct nk_rect content;

NK_ASSERT(state);
NK_ASSERT(style);
NK_ASSERT(font);
NK_ASSERT(out);
if (!out || !style || !font || !state)
return nk_false;

ret = nk_do_button(state, out, bounds, style, in, behavior, &content);
if (style->draw_begin) style->draw_begin(out, style->userdata);
nk_draw_button_symbol(out, &bounds, &content, *state, style, symbol, font);
if (style->draw_end) style->draw_end(out, style->userdata);
return ret;
}